

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O0

string * anon_unknown.dwarf_2b41b::parent_dir(string *path)

{
  long lVar1;
  ulong in_RSI;
  string *in_RDI;
  size_t pos;
  
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string parent_dir(const std::string & path) {
	
	size_t pos = path.find_last_of(setup::path_sep);
	if(pos == std::string::npos) {
		return std::string();
	}
	
	return path.substr(0, pos);
}